

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

VarSlice * __thiscall kratos::Var::operator[](Var *this,shared_ptr<kratos::Var> *var)

{
  bool bVar1;
  uint uVar2;
  element_type *peVar3;
  Var *pVVar4;
  element_type *peVar5;
  element_type *peVar6;
  Var *local_78;
  undefined1 local_70 [8];
  shared_ptr<kratos::VarVarSlice> var_slice;
  undefined1 local_50 [8];
  shared_ptr<kratos::VarVarSlice> s_;
  shared_ptr<kratos::VarSlice> *s;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
  *__range1;
  shared_ptr<kratos::Var> *var_local;
  Var *this_local;
  
  __end1 = std::
           vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
           ::begin(&this->slices_);
  s = (shared_ptr<kratos::VarSlice> *)
      std::
      vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
      ::end(&this->slices_);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::shared_ptr<kratos::VarSlice>_*,_std::vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>_>
                                *)&s);
    if (!bVar1) {
      local_78 = this;
      std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                (&var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
      std::make_shared<kratos::VarVarSlice,kratos::Var*,kratos::Var*>((Var **)local_70,&local_78);
      std::
      vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>::
      emplace_back<std::shared_ptr<kratos::VarVarSlice>&>
                ((vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
                  *)&this->slices_,(shared_ptr<kratos::VarVarSlice> *)local_70);
      if (this->width_param_ != (Var *)0x0) {
        peVar6 = std::
                 __shared_ptr_access<kratos::VarVarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<kratos::VarVarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_70);
        (*(peVar6->super_VarSlice).super_Var.super_IRNode._vptr_IRNode[0x23])
                  (peVar6,this->width_param_);
      }
      peVar6 = std::
               __shared_ptr_access<kratos::VarVarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<kratos::VarVarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_70);
      var_slice.super___shared_ptr<kratos::VarVarSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._0_4_ = 1;
      std::shared_ptr<kratos::VarVarSlice>::~shared_ptr((shared_ptr<kratos::VarVarSlice> *)local_70)
      ;
      return &peVar6->super_VarSlice;
    }
    s_.super___shared_ptr<kratos::VarVarSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         __gnu_cxx::
         __normal_iterator<std::shared_ptr<kratos::VarSlice>_*,_std::vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>_>
         ::operator*(&__end1);
    peVar3 = std::__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)s_.super___shared_ptr<kratos::VarVarSlice,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
    uVar2 = (*(peVar3->super_Var).super_IRNode._vptr_IRNode[0x2b])();
    if ((uVar2 & 1) != 0) {
      std::__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 s_.super___shared_ptr<kratos::VarVarSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
      as<kratos::VarVarSlice>((Var *)local_50);
      peVar6 = std::
               __shared_ptr_access<kratos::VarVarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::VarVarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_50);
      pVVar4 = VarVarSlice::sliced_var(peVar6);
      peVar5 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                         (&var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
      if (pVVar4 == peVar5) {
        this_local = (Var *)std::
                            __shared_ptr_access<kratos::VarVarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator*((__shared_ptr_access<kratos::VarVarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)local_50);
      }
      var_slice.super___shared_ptr<kratos::VarVarSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._1_3_ = 0;
      var_slice.super___shared_ptr<kratos::VarVarSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._0_1_ = pVVar4 == peVar5;
      std::shared_ptr<kratos::VarVarSlice>::~shared_ptr((shared_ptr<kratos::VarVarSlice> *)local_50)
      ;
      if ((uint)var_slice.super___shared_ptr<kratos::VarVarSlice,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != 0) {
        return (VarSlice *)this_local;
      }
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<kratos::VarSlice>_*,_std::vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

VarSlice &Var::operator[](const std::shared_ptr<Var> &var) {
    // if there is one already
    for (auto const &s : slices_) {
        if (s->sliced_by_var()) {
            auto const s_ = s->as<VarVarSlice>();
            if (s_->sliced_var() == var.get()) return *s_;
        }
    }
    auto var_slice = ::make_shared<VarVarSlice>(this, var.get());
    slices_.emplace_back(var_slice);
    if (width_param_) {
        var_slice->set_width_param(width_param_);
    }
    return *var_slice;
}